

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMinUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *dispatcher,bool updateOverlaps)

{
  short *psVar1;
  btOverlappingPairCallback *pbVar2;
  ushort uVar3;
  ulong uVar4;
  Edge EVar5;
  undefined6 in_register_00000012;
  Edge *pEVar6;
  Handle *handle1;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  short *psVar11;
  long lVar12;
  long lVar13;
  
  lVar10 = (long)axis;
  uVar4 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar3 = this->m_pEdges[lVar10][uVar4 + 1].m_handle;
  if (uVar3 != 0) {
    pEVar6 = this->m_pEdges[lVar10] + uVar4;
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    uVar8 = 1 << (sbyte)uVar9 & 3;
    psVar11 = (short *)((long)this->m_pHandles->m_maxEdges +
                       lVar10 * 2 + (ulong)((uint)pEVar6->m_handle * 0x50) + -6);
    EVar5.m_handle = 0;
    EVar5.m_pos = pEVar6->m_pos;
    do {
      if (EVar5.m_pos < pEVar6[1].m_pos) {
        return;
      }
      lVar7 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
              ((ulong)((uint)uVar3 * 0x50) - 0x1c);
      lVar13 = 0x3c;
      if (((((pEVar6[1].m_pos & 1) != 0) && (lVar13 = 0x42, updateOverlaps)) &&
          (lVar12 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                    ((ulong)((uint)pEVar6->m_handle * 0x50) - 0x1c),
          *(ushort *)(lVar7 + 0x3c + (ulong)(uVar9 * 2)) <=
          *(ushort *)(lVar12 + 0x42 + (ulong)(uVar9 * 2)))) &&
         (((*(ushort *)(lVar12 + 0x3c + (ulong)(uVar9 * 2)) <=
            *(ushort *)(lVar7 + 0x42 + (ulong)(uVar9 * 2)) &&
           (uVar4 = (ulong)(uVar8 * 2),
           *(ushort *)(lVar7 + 0x3c + uVar4) <= *(ushort *)(lVar12 + 0x42 + uVar4))) &&
          (uVar4 = (ulong)(uVar8 * 2),
          *(ushort *)(lVar12 + 0x3c + uVar4) <= *(ushort *)(lVar7 + 0x42 + uVar4))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,lVar12,lVar7,dispatcher);
        pbVar2 = this->m_userPairCallback;
        if (pbVar2 != (btOverlappingPairCallback *)0x0) {
          (*pbVar2->_vptr_btOverlappingPairCallback[3])(pbVar2,lVar12,lVar7,dispatcher);
        }
      }
      psVar1 = (short *)(lVar7 + lVar13 + lVar10 * 2);
      *psVar1 = *psVar1 + -1;
      *psVar11 = *psVar11 + 1;
      EVar5 = *pEVar6;
      *pEVar6 = pEVar6[1];
      pEVar6[1] = EVar5;
      uVar3 = pEVar6[2].m_handle;
      pEVar6 = pEVar6 + 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}